

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi_uc * stbi__resample_row_generic(stbi_uc *out,stbi_uc *in_near,stbi_uc *in_far,int w,int hs)

{
  stbi_uc *psVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  psVar1 = out;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < hs) {
    uVar4 = (ulong)(uint)hs;
  }
  uVar2 = (ulong)(uint)w;
  if (w < 1) {
    uVar2 = uVar3;
  }
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      out[uVar5] = in_near[uVar3];
    }
    out = out + hs;
  }
  return psVar1;
}

Assistant:

static stbi_uc *stbi__resample_row_generic(stbi_uc *out, stbi_uc *in_near, stbi_uc *in_far, int w, int hs)
{
   // resample with nearest-neighbor
   int i,j;
   STBI_NOTUSED(in_far);
   for (i=0; i < w; ++i)
      for (j=0; j < hs; ++j)
         out[i*hs+j] = in_near[i];
   return out;
}